

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_DrawSprite(vissprite_t *spr)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  BYTE BVar6;
  short sVar7;
  short sVar8;
  lighttable_t *plVar9;
  sector_t_conflict *psVar10;
  extsector_t *peVar11;
  lightlist_t *plVar12;
  F3DFloor *pFVar13;
  secplane_t *psVar14;
  sector_t *psVar15;
  vertex_t *pvVar16;
  vertex_t *pvVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  drawseg_t *pdVar24;
  undefined1 auVar25 [16];
  undefined2 uVar26;
  short sVar27;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade;
  FDynamicColormap **ppFVar28;
  FDynamicColormap *pFVar29;
  int iVar30;
  ulong uVar31;
  BYTE *pBVar32;
  short sVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  long lVar37;
  int iVar38;
  short sVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  drawseg_t *ds;
  drawseg_t *pdVar43;
  long lVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  int iVar49;
  undefined1 auVar48 [16];
  float fVar50;
  double dVar51;
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar85;
  int iVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  double dVar98;
  
  plVar9 = (spr->Style).colormap;
  if (((spr->field_0x90 & 1) == 0) && ((spr->field_13).pic == (FTexture *)0x0)) {
    if (((_fake3D & 1) != 0) && ((double)(spr->gpos).Z <= sclipBottom)) {
      return;
    }
    if (((_fake3D & 2) != 0) && (sclipTop <= (double)(spr->gpos).Z)) {
      return;
    }
    R_DrawParticle(spr);
    return;
  }
  sVar7 = spr->x1;
  lVar42 = (long)sVar7;
  sVar8 = spr->x2;
  lVar44 = (long)sVar8;
  if (sVar8 <= sVar7) {
    return;
  }
  psVar10 = spr->sector;
  if (psVar10 == (sector_t_conflict *)0x0) {
    return;
  }
  if (((_fake3D & 1) != 0) && ((double)(spr->field_3).field_0.gzt <= sclipBottom)) {
    return;
  }
  if (((_fake3D & 2) != 0) && (sclipTop <= (double)(spr->field_3).field_0.gzb)) {
    return;
  }
  if ((((fixedcolormap == 0) && (fixedlightlev < 0)) &&
      (peVar11 = psVar10->e, peVar11 != (extsector_t *)0x0)) &&
     (uVar34 = (peVar11->XFloor).lightlist.Count, uVar34 != 0)) {
    if ((_fake3D & 2) == 0) {
      sclipTop = ((psVar10->ceilingplane).normal.Y * ViewPos.Y +
                 (psVar10->ceilingplane).D + (psVar10->ceilingplane).normal.X * ViewPos.X) *
                 (psVar10->ceilingplane).negiC;
    }
    do {
      uVar34 = uVar34 - 1;
      if ((int)uVar34 < 0) goto LAB_002f0418;
      uVar35 = uVar34 & 0x7fffffff;
      plVar12 = (peVar11->XFloor).lightlist.Array;
    } while (plVar12[uVar35].plane.D * plVar12[uVar35].plane.negiC < sclipTop);
    pFVar13 = plVar12[uVar35].caster;
    if ((pFVar13 != (F3DFloor *)0x0) &&
       (((pFVar13->flags >> 0x10 & 1) == 0 ||
        (psVar14 = (pFVar13->bottom).plane, psVar14->D * psVar14->negiC < sclipTop)))) {
      psVar15 = pFVar13->model;
      if ((pFVar13->flags >> 0x1b & 1) == 0) {
        if (psVar15 == (sector_t *)0x0) goto LAB_002f0418;
        ppFVar28 = &plVar12[uVar35].extra_colormap;
      }
      else {
        ppFVar28 = &psVar15->ColorMap;
      }
      pFVar29 = *ppFVar28;
      bVar5 = (spr->Style).RenderStyle.field_0.Flags;
      uVar35 = bVar5 & 0x20;
      uVar34 = uVar35 >> 5 ^ 1;
      if ((bVar5 & 0x10) == 0) {
        uVar34 = uVar35;
      }
      uVar35 = (spr->Style).RenderStyle.AsDWORD;
      uVar36 = uVar35 >> 0x18;
      if ((uVar35 == LegacyRenderStyles[7].AsDWORD) && ((pFVar29->Fade).field_0.d != 0)) {
        pFVar29 = GetSpecialLights((PalEntry)(pFVar29->Color).field_0.field_0,(PalEntry)0x0,
                                   pFVar29->Desaturate);
        uVar36 = (uint)(spr->Style).RenderStyle.field_0.Flags;
      }
      if ((uVar36 & 0x40) == 0) {
        if (uVar34 != 0) {
          color = (pFVar29->Color).field_0.field_0;
          fade.field_0 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
                         PalEntry::InverseColor(&pFVar29->Fade);
          iVar85 = pFVar29->Desaturate;
          goto LAB_002f036c;
        }
      }
      else {
        color = (pFVar29->Color).field_0.field_0;
        iVar85 = pFVar29->Desaturate;
        if (uVar34 == 0) {
          fade.d = 0;
        }
        else {
          fade.d = 0xffffff;
        }
LAB_002f036c:
        pFVar29 = GetSpecialLights((PalEntry)color,(PalEntry)fade.field_0,iVar85);
      }
      uVar31 = (ulong)fixedlightlev;
      if ((long)uVar31 < 0) {
        if ((foggy != '\0') || ((spr->renderflags & 0x10) == 0)) {
          spriteshade = (psVar15->lightlevel + r_actualextralight) * -0x4000 + 0x3d0000;
          dVar45 = (double)spr->depth;
          if (dVar45 <= 0.0078125) {
            dVar45 = 0.0078125;
          }
          dVar45 = r_SpriteVisibility / dVar45;
          if (24.0 <= dVar45) {
            dVar45 = 24.0;
          }
          iVar30 = spriteshade - SUB84(dVar45 + 103079215104.0,0) >> 0x10;
          iVar85 = 0x1f;
          if (iVar30 < 0x1f) {
            iVar85 = iVar30;
          }
          iVar30 = 0;
          if (0 < iVar85) {
            iVar30 = iVar85;
          }
          uVar31 = (ulong)(uint)(iVar30 << 8);
          goto LAB_002f040e;
        }
        if (r_fullbrightignoresectorcolor.Value != false) {
          pFVar29 = &FullNormalLight;
        }
        pBVar32 = pFVar29->Maps;
      }
      else {
LAB_002f040e:
        pBVar32 = pFVar29->Maps + uVar31;
      }
      (spr->Style).colormap = pBVar32;
    }
  }
LAB_002f0418:
  bVar5 = spr->field_0x90;
  dVar45 = 2.2250738585072014e-308;
  if (((bVar5 & 1) != 0) && (spr->floorclip != 0.0)) {
    dVar45 = (double)(spr->field_3).field_0.gzb;
  }
  dVar46 = (double)spr->idepth * InvZtoScale;
  psVar10 = spr->heightsec;
  sVar27 = (short)viewheight;
  iVar85 = viewheight;
  if ((psVar10 == (sector_t_conflict *)0x0) || ((psVar10->MoreFlags & 0x10) != 0)) {
    if ((bVar5 & 1) == 0) {
      dVar98 = 1.79769313486232e+308;
      if (spr->floorclip == 0.0) {
        sVar33 = 0;
      }
      else {
        dVar51 = CenterY + 6755399441055744.0 +
                 (double)spr->yscale *
                 ((double)((spr->field_13).pic)->Height -
                 (spr->floorclip + (spr->field_14).field_0.texturemid));
        iVar30 = SUB84(dVar51,0);
        sVar33 = 0;
        if ((iVar30 < sVar27) && (iVar85 = iVar30, sVar33 = 0, SUB82(dVar51,0) < 1)) {
          iVar85 = 0;
        }
      }
      goto LAB_002f06d2;
    }
    if ((_fake3D & 1) != 0) {
      dVar98 = 1.79769313486232e+308;
      sVar33 = 0;
      goto LAB_002f077c;
    }
    if ((_fake3D & 2) == 0) {
      dVar98 = 1.79769313486232e+308;
      sVar33 = 0;
      goto LAB_002f0822;
    }
    dVar98 = 1.79769313486232e+308;
    sVar33 = 0;
  }
  else {
    BVar6 = spr->FakeFlatStat;
    if (BVar6 != '\x02') {
      dVar98 = ((double)(spr->gpos).Y * (psVar10->floorplane).normal.Y +
               (double)(spr->gpos).X * (psVar10->floorplane).normal.X + (psVar10->floorplane).D) *
               (psVar10->floorplane).negiC;
      dVar51 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar98) * dVar46;
      iVar30 = SUB84(dVar51,0);
      sVar39 = SUB82(dVar51,0);
      if (BVar6 == '\x01') {
        sVar33 = 0;
        if ((((bVar5 & 1) == 0) && (0 < iVar30)) && (sVar33 = sVar27, iVar30 < viewheight)) {
          sVar33 = sVar39;
        }
        goto LAB_002f06d2;
      }
      if ((((bVar5 & 1) == 0) && (iVar30 < sVar27)) && (iVar85 = 0, 0 < sVar39)) {
        iVar85 = iVar30;
      }
      if (dVar45 <= dVar98) {
        dVar45 = dVar98;
      }
    }
    dVar98 = 1.79769313486232e+308;
    if ((psVar10->MoreFlags & 2) == 0) {
      dVar51 = ((double)(spr->gpos).Y * (psVar10->ceilingplane).normal.Y +
               (double)(spr->gpos).X * (psVar10->ceilingplane).normal.X + (psVar10->ceilingplane).D)
               * (psVar10->ceilingplane).negiC;
      dVar53 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar51) * dVar46;
      iVar30 = SUB84(dVar53,0);
      sVar39 = SUB82(dVar53,0);
      if (BVar6 == '\x02') {
        iVar38 = (int)(short)iVar85;
        sVar33 = 0;
        iVar85 = iVar30;
        if (sVar39 < 1) {
          iVar85 = 0;
        }
        if (iVar38 <= iVar30) {
          iVar85 = iVar38;
        }
        if ((bVar5 & 1) != 0) {
          iVar85 = iVar38;
        }
        if (dVar45 <= dVar51) {
          dVar45 = dVar51;
        }
      }
      else {
        if (iVar30 < viewheight) {
          sVar27 = sVar39;
        }
        if (iVar30 < 1) {
          sVar27 = 0;
        }
        dVar98 = dVar51;
        sVar33 = sVar27;
        if ((bVar5 & 1) != 0) {
          sVar33 = 0;
        }
      }
    }
    else {
      sVar33 = 0;
    }
LAB_002f06d2:
    if ((_fake3D & 1) != 0) {
      if ((bVar5 & 1) == 0) {
        pFVar13 = spr->fakefloor;
        dVar51 = sclipBottom;
        if (((pFVar13 != (F3DFloor *)0x0) &&
            (psVar14 = (pFVar13->top).plane, dVar53 = psVar14->D * psVar14->negiC,
            dVar53 < ViewPos.Z)) && (dVar53 == sclipBottom)) {
          psVar14 = (pFVar13->bottom).plane;
          dVar51 = psVar14->D * psVar14->negiC;
        }
        dVar51 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar51) * dVar46;
        iVar30 = SUB84(dVar51,0);
        if ((iVar30 < (short)iVar85) && (iVar85 = 0, 0 < SUB82(dVar51,0))) {
          iVar85 = iVar30;
        }
      }
LAB_002f077c:
      if (dVar45 <= sclipBottom) {
        dVar45 = sclipBottom;
      }
    }
    if ((_fake3D & 2) == 0) goto LAB_002f0822;
    if ((bVar5 & 1) == 0) {
      pFVar13 = spr->fakeceiling;
      dVar51 = sclipTop;
      if (((pFVar13 != (F3DFloor *)0x0) &&
          (psVar14 = (pFVar13->bottom).plane, dVar53 = psVar14->D * psVar14->negiC,
          ViewPos.Z < dVar53)) && (dVar53 == sclipTop)) {
        psVar14 = (pFVar13->top).plane;
        dVar51 = psVar14->D * psVar14->negiC;
      }
      iVar30 = SUB84(CenterY + 6755399441055744.0 + (ViewPos.Z - dVar51) * dVar46,0);
      if (sVar33 < iVar30) {
        iVar38 = viewheight;
        if (iVar30 < viewheight) {
          iVar38 = iVar30;
        }
        sVar33 = (short)iVar38;
      }
    }
  }
  if (sclipTop <= dVar98) {
    dVar98 = sclipTop;
  }
LAB_002f0822:
  if ((short)iVar85 <= sVar33) {
LAB_002f0af8:
    (spr->Style).colormap = plVar9;
    return;
  }
  uVar34 = (uint)sVar7;
  iVar30 = (int)sVar8 - uVar34;
  lVar37 = 0;
  do {
    R_DrawSprite::clipbot[lVar42 + lVar37] = (short)iVar85;
    R_DrawSprite::cliptop[lVar42 + lVar37] = sVar33;
    lVar37 = lVar37 + 1;
    ds = ds_p;
    pdVar24 = firstdrawseg;
  } while (iVar30 != (int)lVar37);
LAB_002f0874:
  auVar25 = _DAT_005d6240;
  pdVar43 = ds;
  if (pdVar24 < ds) {
    do {
      ds = pdVar43 + -1;
      if (pdVar43[-1].fake == 0) {
        sVar27 = pdVar43[-1].x1;
        if (((sVar27 < sVar8) && (sVar33 = pdVar43[-1].x2, sVar7 < sVar33)) &&
           ((bVar5 = pdVar43[-1].silhouette, (bVar5 & 3) != 0 ||
            ((pdVar43[-1].maskedtexturecol != -1 || (pdVar43[-1].bFogBoundary != '\0'))))))
        goto LAB_002f08cc;
      }
      pdVar43 = ds;
      if (ds <= pdVar24) break;
    } while( true );
  }
  if ((spr->field_0x90 & 1) == 0) {
    mfloorclip = R_DrawSprite::clipbot;
    mceilingclip = R_DrawSprite::cliptop;
    if ((spr->field_0x90 & 2) == 0) {
      R_DrawVisSprite(spr);
    }
    else {
      R_DrawWallSprite(spr);
    }
  }
  else {
    if (R_DrawSprite::clipbot[lVar44] <= R_DrawSprite::cliptop[lVar44]) {
      lVar37 = 0;
      while (R_DrawSprite::clipbot[lVar37 + lVar42] <= R_DrawSprite::cliptop[lVar37 + lVar42]) {
        lVar37 = lVar37 + 1;
        if (lVar44 - lVar42 == lVar37) goto LAB_002f0af8;
      }
      if (iVar30 == (int)lVar37) goto LAB_002f0af8;
    }
    if (0 < sVar7) {
      uVar26 = (short)viewheight;
      lVar42 = (ulong)uVar34 - 1;
      auVar47._8_4_ = (int)lVar42;
      auVar47._0_8_ = lVar42;
      auVar47._12_4_ = (int)((ulong)lVar42 >> 0x20);
      uVar31 = 0;
      auVar47 = auVar47 ^ _DAT_005d6240;
      auVar66 = _DAT_005d6f50;
      auVar93 = _DAT_005d6f60;
      auVar97 = _DAT_005d6f70;
      auVar70 = _DAT_005d6230;
      do {
        auVar57 = auVar70 ^ auVar25;
        iVar85 = auVar47._0_4_;
        iVar84 = -(uint)(iVar85 < auVar57._0_4_);
        iVar30 = auVar47._4_4_;
        auVar58._4_4_ = -(uint)(iVar30 < auVar57._4_4_);
        iVar38 = auVar47._8_4_;
        iVar90 = -(uint)(iVar38 < auVar57._8_4_);
        iVar49 = auVar47._12_4_;
        auVar58._12_4_ = -(uint)(iVar49 < auVar57._12_4_);
        auVar77._4_4_ = iVar84;
        auVar77._0_4_ = iVar84;
        auVar77._8_4_ = iVar90;
        auVar77._12_4_ = iVar90;
        auVar91 = pshuflw(in_XMM11,auVar77,0xe8);
        auVar60._4_4_ = -(uint)(auVar57._4_4_ == iVar30);
        auVar60._12_4_ = -(uint)(auVar57._12_4_ == iVar49);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar96 = pshuflw(in_XMM12,auVar60,0xe8);
        auVar58._0_4_ = auVar58._4_4_;
        auVar58._8_4_ = auVar58._12_4_;
        auVar92 = pshuflw(auVar91,auVar58,0xe8);
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar57 = (auVar92 | auVar96 & auVar91) ^ auVar57;
        auVar57 = packssdw(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31) = uVar26;
        }
        auVar58 = auVar60 & auVar77 | auVar58;
        auVar57 = packssdw(auVar58,auVar58);
        auVar92._8_4_ = 0xffffffff;
        auVar92._0_8_ = 0xffffffffffffffff;
        auVar92._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar92,auVar57 ^ auVar92);
        if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 2) = uVar26;
        }
        auVar57 = auVar97 ^ auVar25;
        iVar84 = -(uint)(iVar85 < auVar57._0_4_);
        auVar86._4_4_ = -(uint)(iVar30 < auVar57._4_4_);
        iVar90 = -(uint)(iVar38 < auVar57._8_4_);
        auVar86._12_4_ = -(uint)(iVar49 < auVar57._12_4_);
        auVar59._4_4_ = iVar84;
        auVar59._0_4_ = iVar84;
        auVar59._8_4_ = iVar90;
        auVar59._12_4_ = iVar90;
        auVar76._4_4_ = -(uint)(auVar57._4_4_ == iVar30);
        auVar76._12_4_ = -(uint)(auVar57._12_4_ == iVar49);
        auVar76._0_4_ = auVar76._4_4_;
        auVar76._8_4_ = auVar76._12_4_;
        auVar86._0_4_ = auVar86._4_4_;
        auVar86._8_4_ = auVar86._12_4_;
        auVar57 = auVar76 & auVar59 | auVar86;
        auVar57 = packssdw(auVar57,auVar57);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar18,auVar57 ^ auVar18);
        if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 4) = uVar26;
        }
        auVar60 = pshufhw(auVar59,auVar59,0x84);
        auVar77 = pshufhw(auVar76,auVar76,0x84);
        auVar58 = pshufhw(auVar60,auVar86,0x84);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar61 = (auVar58 | auVar77 & auVar60) ^ auVar61;
        auVar60 = packssdw(auVar61,auVar61);
        if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 6) = uVar26;
        }
        auVar60 = auVar93 ^ auVar25;
        iVar84 = -(uint)(iVar85 < auVar60._0_4_);
        auVar63._4_4_ = -(uint)(iVar30 < auVar60._4_4_);
        iVar90 = -(uint)(iVar38 < auVar60._8_4_);
        auVar63._12_4_ = -(uint)(iVar49 < auVar60._12_4_);
        auVar78._4_4_ = iVar84;
        auVar78._0_4_ = iVar84;
        auVar78._8_4_ = iVar90;
        auVar78._12_4_ = iVar90;
        auVar57 = pshuflw(auVar57,auVar78,0xe8);
        auVar62._4_4_ = -(uint)(auVar60._4_4_ == iVar30);
        auVar62._12_4_ = -(uint)(auVar60._12_4_ == iVar49);
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar60 = pshuflw(auVar96 & auVar91,auVar62,0xe8);
        in_XMM12 = auVar60 & auVar57;
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar57 = pshuflw(auVar57,auVar63,0xe8);
        auVar91._8_4_ = 0xffffffff;
        auVar91._0_8_ = 0xffffffffffffffff;
        auVar91._12_4_ = 0xffffffff;
        auVar91 = (auVar57 | in_XMM12) ^ auVar91;
        auVar57 = packssdw(auVar91,auVar91);
        if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 8) = uVar26;
        }
        auVar63 = auVar62 & auVar78 | auVar63;
        auVar57 = packssdw(auVar63,auVar63);
        auVar96._8_4_ = 0xffffffff;
        auVar96._0_8_ = 0xffffffffffffffff;
        auVar96._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar96,auVar57 ^ auVar96);
        if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 10) = uVar26;
        }
        auVar57 = auVar66 ^ auVar25;
        iVar85 = -(uint)(iVar85 < auVar57._0_4_);
        auVar87._4_4_ = -(uint)(iVar30 < auVar57._4_4_);
        iVar38 = -(uint)(iVar38 < auVar57._8_4_);
        auVar87._12_4_ = -(uint)(iVar49 < auVar57._12_4_);
        auVar64._4_4_ = iVar85;
        auVar64._0_4_ = iVar85;
        auVar64._8_4_ = iVar38;
        auVar64._12_4_ = iVar38;
        auVar79._4_4_ = -(uint)(auVar57._4_4_ == iVar30);
        auVar79._12_4_ = -(uint)(auVar57._12_4_ == iVar49);
        auVar79._0_4_ = auVar79._4_4_;
        auVar79._8_4_ = auVar79._12_4_;
        auVar87._0_4_ = auVar87._4_4_;
        auVar87._8_4_ = auVar87._12_4_;
        auVar57 = auVar79 & auVar64 | auVar87;
        auVar57 = packssdw(auVar57,auVar57);
        auVar19._8_4_ = 0xffffffff;
        auVar19._0_8_ = 0xffffffffffffffff;
        auVar19._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar57 ^ auVar19,auVar57 ^ auVar19);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 0xc) = uVar26;
        }
        auVar57 = pshufhw(auVar64,auVar64,0x84);
        auVar58 = pshufhw(auVar79,auVar79,0x84);
        auVar60 = pshufhw(auVar57,auVar87,0x84);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar65 = (auVar60 | auVar58 & auVar57) ^ auVar65;
        auVar57 = packssdw(auVar65,auVar65);
        if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)((long)R_DrawSprite::cliptop + uVar31 + 0xe) = uVar26;
        }
        lVar42 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + 8;
        auVar70._8_8_ = lVar42 + 8;
        lVar42 = auVar97._8_8_;
        auVar97._0_8_ = auVar97._0_8_ + 8;
        auVar97._8_8_ = lVar42 + 8;
        lVar42 = auVar93._8_8_;
        auVar93._0_8_ = auVar93._0_8_ + 8;
        auVar93._8_8_ = lVar42 + 8;
        lVar42 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + 8;
        auVar66._8_8_ = lVar42 + 8;
        uVar31 = uVar31 + 0x10;
      } while ((sVar7 * 2 + 0xeU & 0x1fff0) != uVar31);
    }
    auVar25 = _DAT_005d6240;
    if (((int)sVar8 < viewwidth + -1) && (uVar34 = viewwidth - sVar8, uVar34 != 0)) {
      sVar7 = (short)viewheight;
      lVar42 = (ulong)uVar34 - 1;
      auVar48._8_4_ = (int)lVar42;
      auVar48._0_8_ = lVar42;
      auVar48._12_4_ = (int)((ulong)lVar42 >> 0x20);
      lVar42 = lVar44 * 2;
      uVar31 = 0;
      auVar48 = auVar48 ^ _DAT_005d6240;
      auVar52 = _DAT_005d6f50;
      auVar54 = _DAT_005d6f60;
      auVar55 = _DAT_005d6f70;
      auVar56 = _DAT_005d6230;
      do {
        auVar66 = auVar56 ^ auVar25;
        iVar85 = auVar48._0_4_;
        iVar84 = -(uint)(iVar85 < auVar66._0_4_);
        iVar30 = auVar48._4_4_;
        auVar68._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
        iVar38 = auVar48._8_4_;
        iVar90 = -(uint)(iVar38 < auVar66._8_4_);
        iVar49 = auVar48._12_4_;
        auVar68._12_4_ = -(uint)(iVar49 < auVar66._12_4_);
        auVar80._4_4_ = iVar84;
        auVar80._0_4_ = iVar84;
        auVar80._8_4_ = iVar90;
        auVar80._12_4_ = iVar90;
        auVar93 = pshuflw(in_XMM11,auVar80,0xe8);
        auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
        auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar49);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar97 = pshuflw(in_XMM12,auVar67,0xe8);
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar66 = pshuflw(auVar93,auVar68,0xe8);
        auVar94._8_4_ = 0xffffffff;
        auVar94._0_8_ = 0xffffffffffffffff;
        auVar94._12_4_ = 0xffffffff;
        auVar94 = (auVar66 | auVar97 & auVar93) ^ auVar94;
        auVar66 = packssdw(auVar94,auVar94);
        if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          R_DrawSprite::cliptop[lVar44 + uVar31] = sVar7;
        }
        auVar68 = auVar67 & auVar80 | auVar68;
        auVar66 = packssdw(auVar68,auVar68);
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        auVar66 = packssdw(auVar66 ^ auVar20,auVar66 ^ auVar20);
        if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
          *(short *)(lVar42 + 0x17af5a2 + uVar31 * 2) = sVar7;
        }
        auVar66 = auVar55 ^ auVar25;
        iVar84 = -(uint)(iVar85 < auVar66._0_4_);
        auVar88._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
        iVar90 = -(uint)(iVar38 < auVar66._8_4_);
        auVar88._12_4_ = -(uint)(iVar49 < auVar66._12_4_);
        auVar69._4_4_ = iVar84;
        auVar69._0_4_ = iVar84;
        auVar69._8_4_ = iVar90;
        auVar69._12_4_ = iVar90;
        auVar81._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
        auVar81._12_4_ = -(uint)(auVar66._12_4_ == iVar49);
        auVar81._0_4_ = auVar81._4_4_;
        auVar81._8_4_ = auVar81._12_4_;
        auVar88._0_4_ = auVar88._4_4_;
        auVar88._8_4_ = auVar88._12_4_;
        auVar66 = auVar81 & auVar69 | auVar88;
        auVar66 = packssdw(auVar66,auVar66);
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar66 = packssdw(auVar66 ^ auVar21,auVar66 ^ auVar21);
        if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(lVar42 + 0x17af5a4 + uVar31 * 2) = sVar7;
        }
        auVar70 = pshufhw(auVar69,auVar69,0x84);
        auVar57 = pshufhw(auVar81,auVar81,0x84);
        auVar47 = pshufhw(auVar70,auVar88,0x84);
        auVar71._8_4_ = 0xffffffff;
        auVar71._0_8_ = 0xffffffffffffffff;
        auVar71._12_4_ = 0xffffffff;
        auVar71 = (auVar47 | auVar57 & auVar70) ^ auVar71;
        auVar70 = packssdw(auVar71,auVar71);
        if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(lVar42 + 0x17af5a6 + uVar31 * 2) = sVar7;
        }
        auVar70 = auVar54 ^ auVar25;
        iVar84 = -(uint)(iVar85 < auVar70._0_4_);
        auVar73._4_4_ = -(uint)(iVar30 < auVar70._4_4_);
        iVar90 = -(uint)(iVar38 < auVar70._8_4_);
        auVar73._12_4_ = -(uint)(iVar49 < auVar70._12_4_);
        auVar82._4_4_ = iVar84;
        auVar82._0_4_ = iVar84;
        auVar82._8_4_ = iVar90;
        auVar82._12_4_ = iVar90;
        auVar66 = pshuflw(auVar66,auVar82,0xe8);
        auVar72._4_4_ = -(uint)(auVar70._4_4_ == iVar30);
        auVar72._12_4_ = -(uint)(auVar70._12_4_ == iVar49);
        auVar72._0_4_ = auVar72._4_4_;
        auVar72._8_4_ = auVar72._12_4_;
        auVar93 = pshuflw(auVar97 & auVar93,auVar72,0xe8);
        in_XMM12 = auVar93 & auVar66;
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar66 = pshuflw(auVar66,auVar73,0xe8);
        auVar95._8_4_ = 0xffffffff;
        auVar95._0_8_ = 0xffffffffffffffff;
        auVar95._12_4_ = 0xffffffff;
        auVar95 = (auVar66 | in_XMM12) ^ auVar95;
        auVar66 = packssdw(auVar95,auVar95);
        if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(lVar42 + 0x17af5a8 + uVar31 * 2) = sVar7;
        }
        auVar73 = auVar72 & auVar82 | auVar73;
        auVar66 = packssdw(auVar73,auVar73);
        auVar22._8_4_ = 0xffffffff;
        auVar22._0_8_ = 0xffffffffffffffff;
        auVar22._12_4_ = 0xffffffff;
        auVar66 = packssdw(auVar66 ^ auVar22,auVar66 ^ auVar22);
        if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)(lVar42 + 0x17af5aa + uVar31 * 2) = sVar7;
        }
        auVar66 = auVar52 ^ auVar25;
        iVar85 = -(uint)(iVar85 < auVar66._0_4_);
        auVar89._4_4_ = -(uint)(iVar30 < auVar66._4_4_);
        iVar38 = -(uint)(iVar38 < auVar66._8_4_);
        auVar89._12_4_ = -(uint)(iVar49 < auVar66._12_4_);
        auVar74._4_4_ = iVar85;
        auVar74._0_4_ = iVar85;
        auVar74._8_4_ = iVar38;
        auVar74._12_4_ = iVar38;
        auVar83._4_4_ = -(uint)(auVar66._4_4_ == iVar30);
        auVar83._12_4_ = -(uint)(auVar66._12_4_ == iVar49);
        auVar83._0_4_ = auVar83._4_4_;
        auVar83._8_4_ = auVar83._12_4_;
        auVar89._0_4_ = auVar89._4_4_;
        auVar89._8_4_ = auVar89._12_4_;
        auVar66 = auVar83 & auVar74 | auVar89;
        auVar66 = packssdw(auVar66,auVar66);
        auVar23._8_4_ = 0xffffffff;
        auVar23._0_8_ = 0xffffffffffffffff;
        auVar23._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar66 ^ auVar23,auVar66 ^ auVar23);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(lVar42 + 0x17af5ac + uVar31 * 2) = sVar7;
        }
        auVar66 = pshufhw(auVar74,auVar74,0x84);
        auVar97 = pshufhw(auVar83,auVar83,0x84);
        auVar93 = pshufhw(auVar66,auVar89,0x84);
        auVar75._8_4_ = 0xffffffff;
        auVar75._0_8_ = 0xffffffffffffffff;
        auVar75._12_4_ = 0xffffffff;
        auVar75 = (auVar93 | auVar97 & auVar66) ^ auVar75;
        auVar66 = packssdw(auVar75,auVar75);
        if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(lVar42 + 0x17af5ae + uVar31 * 2) = sVar7;
        }
        uVar31 = uVar31 + 8;
        lVar37 = auVar56._8_8_;
        auVar56._0_8_ = auVar56._0_8_ + 8;
        auVar56._8_8_ = lVar37 + 8;
        lVar37 = auVar55._8_8_;
        auVar55._0_8_ = auVar55._0_8_ + 8;
        auVar55._8_8_ = lVar37 + 8;
        lVar37 = auVar54._8_8_;
        auVar54._0_8_ = auVar54._0_8_ + 8;
        auVar54._8_8_ = lVar37 + 8;
        lVar37 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 8;
        auVar52._8_8_ = lVar37 + 8;
      } while (((ulong)uVar34 + 7 & 0xfffffffffffffff8) != uVar31);
    }
    dVar46 = (double)(spr->field_3).field_0.gzt;
    iVar85 = 0;
    if (dVar98 < dVar46) {
      iVar85 = SUB84((dVar46 - dVar98) / (double)spr->yscale + 6755399441055744.0,0);
    }
    iVar30 = 0x7fffffff;
    if ((double)(spr->field_3).field_0.gzb <= dVar45) {
      iVar30 = SUB84((dVar46 - dVar45) / (double)spr->yscale + 6755399441055744.0,0);
    }
    R_DrawVisVoxel(spr,iVar85,iVar30,R_DrawSprite::cliptop,R_DrawSprite::clipbot);
  }
  (spr->Style).colormap = plVar9;
  return;
LAB_002f08cc:
  uVar35 = (int)sVar27;
  if (sVar27 <= sVar7) {
    uVar35 = uVar34;
  }
  if (sVar8 <= sVar33) {
    sVar33 = sVar8;
  }
  iVar85 = (int)sVar33;
  if ((spr->field_0x90 & 2) == 0) {
    fVar1 = pdVar43[-1].sz1;
    fVar50 = pdVar43[-1].sz2;
    fVar2 = fVar1;
    if (fVar50 <= fVar1) {
      fVar2 = fVar50;
    }
    if (spr->depth < fVar2) goto LAB_002f09b3;
    if (fVar50 <= fVar1) {
      fVar50 = fVar1;
    }
    if (fVar50 <= spr->depth) goto LAB_002f094b;
  }
  pvVar16 = ds->curline->v1;
  pvVar17 = ds->curline->v2;
  dVar46 = (pvVar16->p).X;
  dVar51 = (pvVar16->p).Y;
  uVar3 = (spr->gpos).X;
  uVar4 = (spr->gpos).Y;
  if (((pvVar17->p).Y - dVar51) * ((double)(float)uVar3 - dVar46) <
      ((pvVar17->p).X - dVar46) * ((double)(float)uVar4 - dVar51)) {
LAB_002f094b:
    if ((bVar5 & 1) != 0) {
      lVar40 = (long)(int)uVar35;
      lVar37 = pdVar43[-1].sprbottomclip * 2 + openings;
      lVar41 = 0;
      do {
        sVar33 = *(short *)(lVar37 + lVar40 * 2 + (long)sVar27 * -2 + lVar41 * 2);
        if (sVar33 < R_DrawSprite::clipbot[lVar40 + lVar41]) {
          R_DrawSprite::clipbot[lVar40 + lVar41] = sVar33;
        }
        lVar41 = lVar41 + 1;
      } while (iVar85 - uVar35 != (int)lVar41);
    }
    if ((bVar5 & 2) != 0) {
      lVar40 = (long)(int)uVar35;
      lVar41 = pdVar43[-1].sprtopclip * 2 + openings;
      sVar27 = pdVar43[-1].x1;
      lVar37 = 0;
      do {
        sVar33 = *(short *)(lVar41 + lVar40 * 2 + (long)sVar27 * -2 + lVar37 * 2);
        if (R_DrawSprite::cliptop[lVar40 + lVar37] < sVar33) {
          R_DrawSprite::cliptop[lVar40 + lVar37] = sVar33;
        }
        lVar37 = lVar37 + 1;
      } while (iVar85 - uVar35 != (int)lVar37);
    }
    goto LAB_002f0874;
  }
LAB_002f09b3:
  if ((pdVar43[-1].CurrentPortalUniq == CurrentPortalUniq) &&
     ((pdVar43[-1].maskedtexturecol != -1 || (pdVar43[-1].bFogBoundary != '\0')))) {
    R_RenderMaskedSegRange(ds,uVar35,iVar85);
    pdVar24 = firstdrawseg;
  }
  goto LAB_002f0874;
}

Assistant:

void R_DrawSprite (vissprite_t *spr)
{
	static short clipbot[MAXWIDTH];
	static short cliptop[MAXWIDTH];
	drawseg_t *ds;
	int i;
	int x1, x2;
	int r1, r2;
	short topclip, botclip;
	short *clip1, *clip2;
	lighttable_t *colormap = spr->Style.colormap;
	F3DFloor *rover;
	FDynamicColormap *mybasecolormap;

	// [RH] Check for particles
	if (!spr->bIsVoxel && spr->pic == NULL)
	{
		// kg3D - reject invisible parts
		if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gpos.Z <= sclipBottom) return;
		if ((fake3D & FAKE3D_CLIPTOP)    && spr->gpos.Z >= sclipTop) return;
		R_DrawParticle (spr);
		return;
	}

	x1 = spr->x1;
	x2 = spr->x2;

	// [RH] Quickly reject sprites with bad x ranges.
	if (x1 >= x2)
		return;

	// [RH] Sprites split behind a one-sided line can also be discarded.
	if (spr->sector == NULL)
		return;

	// kg3D - reject invisible parts
	if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gzt <= sclipBottom) return;
	if ((fake3D & FAKE3D_CLIPTOP)    && spr->gzb >= sclipTop) return;

	// kg3D - correct colors now
	if (!fixedcolormap && fixedlightlev < 0 && spr->sector->e && spr->sector->e->XFloor.lightlist.Size()) 
	{
		if (!(fake3D & FAKE3D_CLIPTOP))
		{
			sclipTop = spr->sector->ceilingplane.ZatPoint(ViewPos);
		}
		sector_t *sec = NULL;
		for (i = spr->sector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (sclipTop <= spr->sector->e->XFloor.lightlist[i].plane.Zat0()) 
			{
				rover = spr->sector->e->XFloor.lightlist[i].caster;
				if (rover) 
				{
					if (rover->flags & FF_DOUBLESHADOW && sclipTop <= rover->bottom.plane->Zat0())
					{
						break;
					}
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
					{
						mybasecolormap = sec->ColorMap;
					}
					else
					{
						mybasecolormap = spr->sector->e->XFloor.lightlist[i].extra_colormap;
					}
				}
				break;
			}
		}
		// found new values, recalculate
		if (sec) 
		{
			INTBOOL invertcolormap = (spr->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

			if (spr->Style.RenderStyle.Flags & STYLEF_InvertSource)
			{
				invertcolormap = !invertcolormap;
			}

			// Sprites that are added to the scene must fade to black.
			if (spr->Style.RenderStyle == LegacyRenderStyles[STYLE_Add] && mybasecolormap->Fade != 0)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, 0, mybasecolormap->Desaturate);
			}

			if (spr->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
			{
				if (invertcolormap)
				{ // Fade to white
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255,255,255), mybasecolormap->Desaturate);
					invertcolormap = false;
				}
				else
				{ // Fade to black
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0,0,0), mybasecolormap->Desaturate);
				}
			}

			// get light level
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				spr->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && (spr->renderflags & RF_FULLBRIGHT))
			{ // full bright
				spr->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;
			}
			else
			{ // diminished light
				spriteshade = LIGHT2SHADE(sec->lightlevel + r_actualextralight);
				spr->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(
					r_SpriteVisibility / MAX(MINZ, (double)spr->depth), spriteshade) << COLORMAPSHIFT);
			}
		}
	}

	// [RH] Initialize the clipping arrays to their largest possible range
	// instead of using a special "not clipped" value. This eliminates
	// visual anomalies when looking down and should be faster, too.
	topclip = 0;
	botclip = viewheight;

	// killough 3/27/98:
	// Clip the sprite against deep water and/or fake ceilings.
	// [RH] rewrote this to be based on which part of the sector is really visible

	double scale = InvZtoScale * spr->idepth;
	double hzb = DBL_MIN, hzt = DBL_MAX;

	if (spr->bIsVoxel && spr->floorclip != 0)
	{
		hzb = spr->gzb;
	}

	if (spr->heightsec && !(spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC))
	{ // only things in specially marked sectors
		if (spr->FakeFlatStat != FAKED_AboveCeiling)
		{
			double hz = spr->heightsec->floorplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_BelowFloor)
			{ // seen below floor: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = short(MIN(h, viewheight));
				}
				hzt = MIN(hzt, hz);
			}
			else
			{ // seen in the middle: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
		}
		if (spr->FakeFlatStat != FAKED_BelowFloor && !(spr->heightsec->MoreFlags & SECF_FAKEFLOORONLY))
		{
			double hz = spr->heightsec->ceilingplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_AboveCeiling)
			{ // seen above ceiling: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
			else
			{ // seen in the middle: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = MIN(h, viewheight);
				}
				hzt = MIN(hzt, hz);
			}
		}
	}
	// killough 3/27/98: end special clipping for deep water / fake ceilings
	else if (!spr->bIsVoxel && spr->floorclip)
	{ // [RH] Move floorclip stuff from R_DrawVisSprite to here
		//int clip = ((FLOAT2FIXED(CenterY) - FixedMul (spr->texturemid - (spr->pic->GetHeight() << FRACBITS) + spr->floorclip, spr->yscale)) >> FRACBITS);
		int clip = xs_RoundToInt(CenterY - (spr->texturemid - spr->pic->GetHeight() + spr->floorclip) * spr->yscale);
		if (clip < botclip)
		{
			botclip = MAX<short>(0, clip);
		}
	}

	if (fake3D & FAKE3D_CLIPBOTTOM)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipBottom;
			if (spr->fakefloor)
			{
				double floorz = spr->fakefloor->top.plane->Zat0();
				if (ViewPos.Z > floorz && floorz == sclipBottom )
				{
					hz = spr->fakefloor->bottom.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h < botclip)
			{
				botclip = MAX<short>(0, h);
			}
		}
		hzb = MAX(hzb, sclipBottom);
	}
	if (fake3D & FAKE3D_CLIPTOP)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipTop;
			if (spr->fakeceiling != NULL)
			{
				double ceilingZ = spr->fakeceiling->bottom.plane->Zat0();
				if (ViewPos.Z < ceilingZ && ceilingZ == sclipTop)
				{
					hz = spr->fakeceiling->top.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h > topclip)
			{
				topclip = short(MIN(h, viewheight));
			}
		}
		hzt = MIN(hzt, sclipTop);
	}

#if 0
	// [RH] Sprites that were split by a drawseg should also be clipped
	// by the sector's floor and ceiling. (Not sure how/if to handle this
	// with fake floors, since those already do clipping.)
	if (spr->bSplitSprite &&
		(spr->heightsec == NULL || (spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)))
	{
		fixed_t h = spr->sector->floorplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h < botclip)
		{
			botclip = MAX<short> (0, h);
		}
		h = spr->sector->ceilingplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h > topclip)
		{
			topclip = short(MIN(h, viewheight));
		}
	}
#endif

	if (topclip >= botclip)
	{
		spr->Style.colormap = colormap;
		return;
	}

	i = x2 - x1;
	clip1 = clipbot + x1;
	clip2 = cliptop + x1;
	do
	{
		*clip1++ = botclip;
		*clip2++ = topclip;
	} while (--i);

	// Scan drawsegs from end to start for obscuring segs.
	// The first drawseg that is closer than the sprite is the clip seg.

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	for (ds = ds_p; ds-- > firstdrawseg; )  // new -- killough
	{
		// [ZZ] portal handling here
		//if (ds->CurrentPortalUniq != spr->CurrentPortalUniq)
		//	continue;
		// [ZZ] WARNING: uncommenting the two above lines, totally breaks sprite clipping

		// kg3D - no clipping on fake segs
		if (ds->fake) continue;
		// determine if the drawseg obscures the sprite
		if (ds->x1 >= x2 || ds->x2 <= x1 ||
			(!(ds->silhouette & SIL_BOTH) && ds->maskedtexturecol == -1 &&
			 !ds->bFogBoundary) )
		{
			// does not cover sprite
			continue;
		}

		r1 = MAX<int> (ds->x1, x1);
		r2 = MIN<int> (ds->x2, x2);

		float neardepth, fardepth;
		if (!spr->bWallSprite)
		{
			if (ds->sz1 < ds->sz2)
			{
				neardepth = ds->sz1, fardepth = ds->sz2;
			}
			else
			{
				neardepth = ds->sz2, fardepth = ds->sz1;
			}
		}
		// Check if sprite is in front of draw seg:
		if ((!spr->bWallSprite && neardepth > spr->depth) || ((spr->bWallSprite || fardepth > spr->depth) &&
			(spr->gpos.Y - ds->curline->v1->fY()) * (ds->curline->v2->fX() - ds->curline->v1->fX()) -
			(spr->gpos.X - ds->curline->v1->fX()) * (ds->curline->v2->fY() - ds->curline->v1->fY()) <= 0))
		{
			// seg is behind sprite, so draw the mid texture if it has one
			if (ds->CurrentPortalUniq == CurrentPortalUniq && // [ZZ] instead, portal uniq check is made here
				(ds->maskedtexturecol != -1 || ds->bFogBoundary))
				R_RenderMaskedSegRange (ds, r1, r2);
			continue;
		}

		// clip this piece of the sprite
		// killough 3/27/98: optimized and made much shorter
		// [RH] Optimized further (at least for VC++;
		// other compilers should be at least as good as before)

		if (ds->silhouette & SIL_BOTTOM) //bottom sil
		{
			clip1 = clipbot + r1;
			clip2 = openings + ds->sprbottomclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 > *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}

		if (ds->silhouette & SIL_TOP)   // top sil
		{
			clip1 = cliptop + r1;
			clip2 = openings + ds->sprtopclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 < *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}
	}

	// all clipping has been performed, so draw the sprite

	if (!spr->bIsVoxel)
	{
		mfloorclip = clipbot;
		mceilingclip = cliptop;
		if (!spr->bWallSprite)
		{
			R_DrawVisSprite(spr);
		}
		else
		{
			R_DrawWallSprite(spr);
		}
	}
	else
	{
		// If it is completely clipped away, don't bother drawing it.
		if (cliptop[x2] >= clipbot[x2])
		{
			for (i = x1; i < x2; ++i)
			{
				if (cliptop[i] < clipbot[i])
				{
					break;
				}
			}
			if (i == x2)
			{
				spr->Style.colormap = colormap;
				return;
			}
		}
		// Add everything outside the left and right edges to the clipping array
		// for R_DrawVisVoxel().
		if (x1 > 0)
		{
			fillshort(cliptop, x1, viewheight);
		}
		if (x2 < viewwidth - 1)
		{
			fillshort(cliptop + x2, viewwidth - x2, viewheight);
		}
		int minvoxely = spr->gzt <= hzt ? 0 : xs_RoundToInt((spr->gzt - hzt) / spr->yscale);
		int maxvoxely = spr->gzb > hzb ? INT_MAX : xs_RoundToInt((spr->gzt - hzb) / spr->yscale);
		R_DrawVisVoxel(spr, minvoxely, maxvoxely, cliptop, clipbot);
	}
	spr->Style.colormap = colormap;
}